

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarchingCube.cpp
# Opt level: O2

void __thiscall
MarchingCube::run(MarchingCube *this,Field<double,_unsigned_short> *F,uint64_t iteration)

{
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  unique_ptr<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
  uVar10;
  ushort uVar11;
  undefined4 uVar12;
  _Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false> _Var13;
  undefined4 uVar14;
  ushort uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  undefined1 auVar19 [8];
  ostream *poVar20;
  ushort uVar21;
  size_type __new_size;
  ushort uVar22;
  char *pcVar23;
  float fVar24;
  float fVar25;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar26;
  double dVar27;
  double y;
  double dVar28;
  double dVar29;
  double z;
  float fVar30;
  double dVar31;
  vec3 vVar32;
  vec3 p1;
  vec3 p1_00;
  vec3 p1_01;
  vec3 p1_02;
  vec3 p1_03;
  vec3 p1_04;
  vec3 p1_05;
  vec3 p1_06;
  vec3 p1_07;
  vec3 p1_08;
  vec3 p;
  vec3 p_00;
  vec3 vVar34;
  vec3 p2;
  vec3 p2_00;
  vec3 p2_01;
  vec3 p2_02;
  vec3 p2_03;
  vec3 p2_04;
  vec3 p2_05;
  vec3 p2_06;
  vec3 p2_07;
  vec3 p2_08;
  vec3 p2_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  size_t __n;
  streambuf local_478 [8];
  filebuf fb_binary;
  undefined1 local_378 [8];
  ostream outstream_binary;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_358;
  undefined8 local_354;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_34c;
  undefined8 local_348;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_340;
  undefined8 local_33c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_334;
  undefined8 local_330;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_328;
  undefined8 local_324;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_31c;
  undefined8 local_318;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_310;
  undefined8 local_30c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_304;
  undefined8 local_300;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_2f8;
  undefined8 local_2f4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_2ec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  undefined1 local_218 [8];
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0 [32];
  string local_1a0 [32];
  double local_180;
  double local_178;
  uint64_t local_170;
  undefined1 auStack_168 [8];
  vector<float,_std::allocator<float>_> normals;
  undefined1 auStack_148 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  string local_128;
  undefined1 auStack_108 [8];
  vector<float,_std::allocator<float>_> vertices;
  undefined8 local_b8;
  undefined8 local_a8;
  _Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false> local_90;
  PlyFile meshFile;
  undefined8 local_78;
  allocator<char> local_3a;
  allocator_type local_39;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_38;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  vec3 p_01;
  vec3 vVar33;
  
  uVar11 = Config::N;
  auStack_108 = (undefined1  [8])0x0;
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  auStack_168 = (undefined1  [8])0x0;
  normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  auStack_148 = (undefined1  [8])0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dVar5 = (double)(int)(Config::N - 1);
  uVar16 = 0;
  local_170 = iteration;
  while ((ushort)uVar16 != uVar11) {
    local_178 = (double)(uVar16 & 0xffff) / dVar5;
    uVar17 = 0;
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = uVar16;
    while ((ushort)uVar17 != uVar11) {
      local_180 = (double)(uVar17 & 0xffff) / dVar5;
      vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = uVar17;
      for (uVar22 = 0; uVar22 != uVar11; uVar22 = uVar22 + 1) {
        meshFile.impl._M_t.
        super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
        .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl =
             (unique_ptr<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
              )((double)(int)(F->_Xsize - 1) * ((double)uVar22 / dVar5));
        dVar31 = (double)(int)(F->_Ysize - 1) * local_180;
        dVar28 = (double)(int)(F->_Zsize - 1) * local_178;
        fVar24 = (float)((double)meshFile.impl._M_t.
                                 super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                                 .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>.
                                 _M_head_impl + -0.5);
        fVar30 = (float)(dVar31 + 0.5);
        local_38.z = (float)(dVar28 + -0.5);
        dVar6 = (double)fVar24;
        dVar27 = (double)fVar30;
        dVar29 = (double)local_38.z;
        dVar7 = interp(this,F,dVar6,dVar27,dVar29);
        fVar25 = (float)((double)meshFile.impl._M_t.
                                 super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                                 .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>.
                                 _M_head_impl + 0.5);
        meshFile.impl._M_t.
        super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
        .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl._4_4_ =
             (int)((ulong)((double)meshFile.impl._M_t.
                                   super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                                   .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>.
                                   _M_head_impl + 0.5) >> 0x20);
        meshFile.impl._M_t.
        super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
        .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl._0_4_ = fVar25;
        dVar8 = (double)fVar25;
        dVar9 = interp(this,F,dVar8,dVar27,dVar29);
        dVar31 = dVar31 + -0.5;
        fVar25 = (float)dVar31;
        path.field_2._8_8_ = CONCAT44((int)((ulong)dVar31 >> 0x20),fVar25);
        y = (double)fVar25;
        dVar31 = interp(this,F,dVar8,y,dVar29);
        dVar29 = interp(this,F,dVar6,y,dVar29);
        aVar26.z = (float)(dVar28 + 0.5);
        z = (double)aVar26.z;
        dVar28 = interp(this,F,dVar6,dVar27,z);
        dVar27 = interp(this,F,dVar8,dVar27,z);
        dVar8 = interp(this,F,dVar8,y,z);
        dVar6 = interp(this,F,dVar6,y,z);
        uVar21 = (dVar7 < 0.0) + 2;
        if (0.0 <= dVar9) {
          uVar21 = (ushort)(dVar7 < 0.0);
        }
        uVar15 = uVar21 + 4;
        if (0.0 <= dVar31) {
          uVar15 = uVar21;
        }
        uVar21 = uVar15 + 8;
        if (0.0 <= dVar29) {
          uVar21 = uVar15;
        }
        uVar15 = uVar21 | 0x10;
        if (0.0 <= dVar28) {
          uVar15 = uVar21;
        }
        uVar21 = uVar15 | 0x20;
        if (0.0 <= dVar27) {
          uVar21 = uVar15;
        }
        uVar15 = uVar21 | 0x40;
        if (0.0 <= dVar8) {
          uVar15 = uVar21;
        }
        uVar21 = uVar15 | 0x80;
        if (0.0 <= dVar6) {
          uVar21 = uVar15;
        }
        uVar15 = _edgeTable._M_elems[uVar21];
        if (uVar15 != 0) {
          uVar14 = meshFile.impl._M_t.
                   super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                   .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl._0_4_
          ;
          if ((uVar15 & 1) != 0) {
            vVar32.field_2 = local_38;
            vVar32.field_0.x = fVar24;
            vVar32.field_1.y = fVar30;
            vVar33.field_2 = local_38;
            vVar33.field_0.x =
                 meshFile.impl._M_t.
                 super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                 .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl._0_4_;
            vVar33.field_1.y = fVar30;
            vVar32 = vInterp(this,vVar32,vVar33,(float)dVar7,(float)dVar9);
            local_378 = (undefined1  [8])vVar32._0_8_;
            _outstream_binary = vVar32.field_2;
          }
          uVar10._M_t.
          super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
          .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl._4_4_ =
               path.field_2._8_4_;
          uVar10._M_t.
          super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
          .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl._0_4_ =
               (int)meshFile.impl._M_t.
                    super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                    .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl;
          meshFile.impl._M_t.
          super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
          .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl =
               (unique_ptr<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                )(unique_ptr<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                  )uVar10._M_t.
                   super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                   .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl;
          if ((uVar15 & 2) != 0) {
            vVar34.field_2 = local_38;
            vVar34.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)uVar14;
            vVar34.field_1.y = fVar30;
            p2.field_2 = local_38;
            p2._0_8_ = uVar10._M_t.
                       super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                       .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl;
            vInterp(this,vVar34,p2,(float)dVar9,(float)dVar31);
          }
          uVar12 = path.field_2._8_4_;
          if ((uVar15 & 4) != 0) {
            p1.field_2 = local_38;
            p1._0_8_ = meshFile.impl._M_t.
                       super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                       .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl;
            p2_00.field_2 = local_38;
            p2_00.field_0.x = fVar24;
            p2_00.field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)path.field_2._8_4_;
            vVar32 = vInterp(this,p1,p2_00,(float)dVar31,(float)dVar29);
            local_358 = vVar32.field_2;
          }
          if ((uVar15 & 8) != 0) {
            p1_00.field_2 = local_38;
            p1_00.field_0.x = fVar24;
            p1_00.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uVar12;
            p2_01.field_2 = local_38;
            p2_01.field_0.x = fVar24;
            p2_01.field_1.y = fVar30;
            vVar32 = vInterp(this,p1_00,p2_01,(float)dVar29,(float)dVar7);
            local_354 = vVar32._0_8_;
            local_34c = vVar32.field_2;
          }
          if ((uVar15 & 0x10) != 0) {
            p1_01.field_2.z = aVar26.z;
            p1_01.field_0.x = fVar24;
            p1_01.field_1.y = fVar30;
            p2_02.field_2.z = aVar26.z;
            p2_02.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)uVar14;
            p2_02.field_1.y = fVar30;
            vVar32 = vInterp(this,p1_01,p2_02,(float)dVar28,(float)dVar27);
            local_348 = vVar32._0_8_;
            local_340 = vVar32.field_2;
          }
          if ((uVar15 & 0x20) != 0) {
            p1_02.field_2.z = aVar26.z;
            p1_02.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)uVar14;
            p1_02.field_1.y = fVar30;
            p2_03.field_2.z = aVar26.z;
            p2_03._0_8_ = meshFile.impl._M_t.
                          super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                          .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>.
                          _M_head_impl;
            vVar32 = vInterp(this,p1_02,p2_03,(float)dVar27,(float)dVar8);
            local_33c = vVar32._0_8_;
            local_334 = vVar32.field_2;
          }
          if ((uVar15 & 0x40) != 0) {
            p1_03.field_2.z = aVar26.z;
            p1_03._0_8_ = meshFile.impl._M_t.
                          super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                          .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>.
                          _M_head_impl;
            p2_04.field_2.z = aVar26.z;
            p2_04.field_0.x = fVar24;
            p2_04.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uVar12;
            vVar32 = vInterp(this,p1_03,p2_04,(float)dVar8,(float)dVar6);
            local_330 = vVar32._0_8_;
            local_328 = vVar32.field_2;
          }
          if ((char)uVar15 < '\0') {
            p1_04.field_2.z = aVar26.z;
            p1_04.field_0.x = fVar24;
            p1_04.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uVar12;
            p2_05.field_2.z = aVar26.z;
            p2_05.field_0.x = fVar24;
            p2_05.field_1.y = fVar30;
            vVar32 = vInterp(this,p1_04,p2_05,(float)dVar6,(float)dVar28);
            local_324 = vVar32._0_8_;
            local_31c = vVar32.field_2;
          }
          if ((uVar15 >> 8 & 1) != 0) {
            p1_05.field_2 = local_38;
            p1_05.field_0.x = fVar24;
            p1_05.field_1.y = fVar30;
            p2_06.field_2.z = aVar26.z;
            p2_06.field_0.x = fVar24;
            p2_06.field_1.y = fVar30;
            vVar32 = vInterp(this,p1_05,p2_06,(float)dVar7,(float)dVar28);
            local_318 = vVar32._0_8_;
            local_310 = vVar32.field_2;
          }
          if ((uVar15 >> 9 & 1) != 0) {
            p1_06.field_2 = local_38;
            p1_06.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)uVar14;
            p1_06.field_1.y = fVar30;
            p2_07.field_2.z = aVar26.z;
            p2_07.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)uVar14;
            p2_07.field_1.y = fVar30;
            vVar32 = vInterp(this,p1_06,p2_07,(float)dVar9,(float)dVar27);
            local_30c = vVar32._0_8_;
            local_304 = vVar32.field_2;
          }
          if ((uVar15 >> 10 & 1) != 0) {
            p1_07.field_2 = local_38;
            p1_07._0_8_ = meshFile.impl._M_t.
                          super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                          .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>.
                          _M_head_impl;
            p2_08.field_2.z = aVar26.z;
            p2_08._0_8_ = meshFile.impl._M_t.
                          super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                          .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>.
                          _M_head_impl;
            vVar32 = vInterp(this,p1_07,p2_08,(float)dVar31,(float)dVar8);
            local_300 = vVar32._0_8_;
            local_2f8 = vVar32.field_2;
          }
          if ((uVar15 >> 0xb & 1) != 0) {
            p1_08.field_2 = local_38;
            p1_08.field_0.x = fVar24;
            p1_08.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uVar12;
            p2_09.field_2.z = aVar26.z;
            p2_09.field_0.x = fVar24;
            p2_09.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uVar12;
            vVar32 = vInterp(this,p1_08,p2_09,(float)dVar29,(float)dVar6);
            local_2f4 = vVar32._0_8_;
            local_2ec = vVar32.field_2;
          }
          pcVar23 = _triTable._M_elems[uVar21]._M_elems + 2;
          while ((ulong)(byte)((array<char,_16UL> *)(pcVar23 + -2))->_M_elems[0] != 0xff) {
            lVar18 = (ulong)(byte)((array<char,_16UL> *)(pcVar23 + -2))->_M_elems[0] * 0xc;
            uVar2 = *(undefined8 *)(local_378 + lVar18);
            aVar26 = *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
                      (&outstream_binary + lVar18);
            uVar3 = *(undefined8 *)(local_378 + (ulong)(byte)pcVar23[-1] * 0xc);
            meshFile.impl._M_t.
            super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
            ._M_t.
            super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
            .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl._0_4_ =
                 (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)
                 *(undefined4 *)(&outstream_binary + (ulong)(byte)pcVar23[-1] * 0xc);
            uVar4 = *(undefined8 *)(local_378 + (ulong)(byte)*pcVar23 * 0xc);
            lVar18 = (long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start - (long)auStack_108;
            aVar1 = *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
                     (&outstream_binary + (ulong)(byte)*pcVar23 * 0xc);
            __new_size = (lVar18 >> 2) + 9;
            std::vector<float,_std::allocator<float>_>::resize
                      ((vector<float,_std::allocator<float>_> *)auStack_108,__new_size);
            *(undefined8 *)((long)auStack_108 + lVar18) = uVar2;
            *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
             ((long)auStack_108 + lVar18 + 8) = aVar26;
            *(undefined8 *)((long)auStack_108 + lVar18 + 0xc) = uVar3;
            *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
             ((long)auStack_108 + lVar18 + 0x14) =
                 meshFile.impl._M_t.
                 super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                 .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl._0_4_;
            *(undefined8 *)((long)auStack_108 + lVar18 + 0x18) = uVar4;
            *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
             ((long)auStack_108 + lVar18 + 0x20) = aVar1;
            p.field_2 = aVar26;
            p.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar2;
            p.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
                        (int)((ulong)uVar2 >> 0x20);
            vVar32 = computeNormal(this,F,p);
            p_00.field_2 = meshFile.impl._M_t.
                           super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                           .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>.
                           _M_head_impl._0_4_;
            p_00.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                           (int)uVar3;
            p_00.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
                           (int)((ulong)uVar3 >> 0x20);
            vVar33 = computeNormal(this,F,p_00);
            meshFile.impl._M_t.
            super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
            ._M_t.
            super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
            .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl._0_4_ =
                 vVar33.field_2;
            p_01.field_2 = aVar1;
            p_01.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                           (int)uVar4;
            p_01.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
                           (int)((ulong)uVar4 >> 0x20);
            vVar34 = computeNormal(this,F,p_01);
            std::vector<float,_std::allocator<float>_>::resize
                      ((vector<float,_std::allocator<float>_> *)auStack_168,__new_size);
            *(long *)((long)auStack_168 + lVar18) = vVar32._0_8_;
            *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
             ((long)auStack_168 + lVar18 + 8) = vVar32.field_2;
            *(long *)((long)auStack_168 + lVar18 + 0xc) = vVar33._0_8_;
            *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
             ((long)auStack_168 + lVar18 + 0x14) =
                 meshFile.impl._M_t.
                 super___uniq_ptr_impl<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_tinyply::PlyFile::PlyFileImpl_*,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                 .super__Head_base<0UL,_tinyply::PlyFile::PlyFileImpl_*,_false>._M_head_impl._0_4_;
            *(long *)((long)auStack_168 + lVar18 + 0x18) = vVar34._0_8_;
            *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
             ((long)auStack_168 + lVar18 + 0x20) = vVar34.field_2;
            pcVar23 = pcVar23 + 3;
          }
        }
      }
      uVar17 = (uint)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 1;
    }
    uVar16 = vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  uVar16 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_148,
             (ulong)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start - (long)auStack_108 >> 2) / 3);
  for (auVar19 = auStack_148;
      auVar19 !=
      (undefined1  [8])
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start; auVar19 = (undefined1  [8])((long)auVar19 + 4)) {
    *(uint *)auVar19 = uVar16;
    uVar16 = uVar16 + 1;
  }
  std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
            ((path *)local_378,(char (*) [11])"result-ply",auto_format);
  std::filesystem::create_directory((path *)local_378);
  std::filesystem::__cxx11::path::~path((path *)local_378);
  std::filebuf::filebuf(local_478);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_218,"result-ply/",(allocator<char> *)local_378);
  std::__cxx11::to_string((string *)local_378,local_170);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378);
  std::__cxx11::string::~string((string *)local_378);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,".ply");
  lVar18 = std::filebuf::open((char *)local_478,local_218._0_4_);
  if (lVar18 == 0) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    poVar20 = std::operator<<((ostream *)&std::cerr,"\x1b[41m\x1b[1m[ERROR]\x1b[49m\x1b[0m ");
    std::endl<char,std::char_traits<char>>(poVar20);
    poVar20 = std::operator<<((ostream *)&std::cerr,"\x1b[1mFILE\x1b[0m    : ");
    poVar20 = std::operator<<(poVar20,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/tmarrec[P]fluid-simulation/src/MarchingCube.cpp"
                             );
    std::endl<char,std::char_traits<char>>(poVar20);
    poVar20 = std::operator<<((ostream *)&std::cerr,"\x1b[1mFUNCTION\x1b[0m: ");
    poVar20 = std::operator<<(poVar20,"run");
    std::endl<char,std::char_traits<char>>(poVar20);
    poVar20 = std::operator<<((ostream *)&std::cerr,"\x1b[1mLINE\x1b[0m    : ");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,0xf5);
    std::endl<char,std::char_traits<char>>(poVar20);
    poVar20 = std::operator<<((ostream *)&std::cerr,"\x1b[1mMESSAGE\x1b[0m : ");
    poVar20 = std::operator<<(poVar20,"Failed to open filebuf");
    std::endl<char,std::char_traits<char>>(poVar20);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  else {
    std::ostream::ostream(local_378,local_478);
    if ((*(byte *)((long)&local_358 + *(long *)((long)local_378 + -0x18)) & 5) == 0) {
      tinyply::PlyFile::PlyFile((PlyFile *)&local_90);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"vertex",&local_33);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"x",&local_32);
      std::__cxx11::string::string<std::allocator<char>>(local_1c0,"y",&local_31);
      std::__cxx11::string::string<std::allocator<char>>(local_1a0,"z",&local_3a);
      __l._M_len = 3;
      __l._M_array = &local_1e0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_260,__l,&local_39);
      tinyply::PlyFile::add_properties_to_element
                ((PlyFile *)&local_90,&local_128,&local_260,FLOAT32,
                 (ulong)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start - (long)auStack_108 >> 2) / 3,
                 (uint8_t *)auStack_108,INVALID,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_260);
      lVar18 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&local_1e0._M_dataplus._M_p + lVar18));
        lVar18 = lVar18 + -0x20;
      } while (lVar18 != -0x20);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"vertex",&local_33);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"nx",&local_32);
      std::__cxx11::string::string<std::allocator<char>>(local_1c0,"ny",&local_31);
      std::__cxx11::string::string<std::allocator<char>>(local_1a0,"nz",&local_3a);
      __l_00._M_len = 3;
      __l_00._M_array = &local_1e0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_248,__l_00,&local_39);
      tinyply::PlyFile::add_properties_to_element
                ((PlyFile *)&local_90,&local_128,&local_248,FLOAT32,
                 (ulong)((long)normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start - (long)auStack_168 >> 2) / 3,
                 (uint8_t *)auStack_168,INVALID,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_248);
      lVar18 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&local_1e0._M_dataplus._M_p + lVar18));
        lVar18 = lVar18 + -0x20;
      } while (lVar18 != -0x20);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"face",&local_33);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"vertex_indices",&local_32);
      __l_01._M_len = 1;
      __l_01._M_array = &local_128;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_230,__l_01,(allocator_type *)&local_31);
      __n = 3;
      tinyply::PlyFile::add_properties_to_element
                ((PlyFile *)&local_90,&local_1e0,&local_230,UINT32,
                 (ulong)((long)indices.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start - (long)auStack_148 >> 2) /
                 3,(uint8_t *)auStack_148,UINT8,3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_230);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_1e0);
      _Var13._M_head_impl = local_90._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"Generated by Tristan Marrec fluid-simulation project.",
                 (allocator<char> *)&local_128);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(_Var13._M_head_impl)->comments,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      tinyply::PlyFile::PlyFileImpl::write(local_90._M_head_impl,(int)local_378,(void *)0x1,__n);
      std::filebuf::close();
      std::
      unique_ptr<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
      ::~unique_ptr((unique_ptr<tinyply::PlyFile::PlyFileImpl,_std::default_delete<tinyply::PlyFile::PlyFileImpl>_>
                     *)&local_90);
      std::ios_base::~ios_base((ios_base *)&outstream_binary);
      std::__cxx11::string::~string((string *)local_218);
      std::filebuf::~filebuf(local_478);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_148);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)auStack_168);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)auStack_108);
      return;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    poVar20 = std::operator<<((ostream *)&std::cerr,"\x1b[41m\x1b[1m[ERROR]\x1b[49m\x1b[0m ");
    std::endl<char,std::char_traits<char>>(poVar20);
    poVar20 = std::operator<<((ostream *)&std::cerr,"\x1b[1mFILE\x1b[0m    : ");
    poVar20 = std::operator<<(poVar20,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/tmarrec[P]fluid-simulation/src/MarchingCube.cpp"
                             );
    std::endl<char,std::char_traits<char>>(poVar20);
    poVar20 = std::operator<<((ostream *)&std::cerr,"\x1b[1mFUNCTION\x1b[0m: ");
    poVar20 = std::operator<<(poVar20,"run");
    std::endl<char,std::char_traits<char>>(poVar20);
    poVar20 = std::operator<<((ostream *)&std::cerr,"\x1b[1mLINE\x1b[0m    : ");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,0xfa);
    std::endl<char,std::char_traits<char>>(poVar20);
    poVar20 = std::operator<<((ostream *)&std::cerr,"\x1b[1mMESSAGE\x1b[0m : ");
    poVar20 = std::operator<<(poVar20,"Failed to open res.ply file");
    std::endl<char,std::char_traits<char>>(poVar20);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  exit(2);
}

Assistant:

void MarchingCube::run(
        const Field<double, std::uint16_t>& F,
        const std::uint64_t iteration
    )
{
    std::vector<float> vertices;
    std::vector<float> normals;
    std::vector<std::uint32_t> indices;
    const std::uint64_t nbEchant = static_cast<std::uint64_t>(Config::N);
    // Marching Cube algorithm
    for (std::uint16_t k = 0; k < nbEchant; ++k)
    {
        for (std::uint16_t j = 0; j < nbEchant; ++j)
        {
            for (std::uint16_t i = 0; i < nbEchant; ++i)
            {
                const double x =
                    (static_cast<double>(i)/static_cast<double>(nbEchant-1)) *
                    (F.x()-1);
                const double y =
                    (static_cast<double>(j)/static_cast<double>(nbEchant-1)) *
                    (F.y()-1);
                const double z =
                    (static_cast<double>(k)/static_cast<double>(nbEchant-1)) *
                    (F.z()-1);

                const double s = 0.5;
                const glm::vec3 p[8] =
                {
                    {x-s, y+s, z-s},
                    {x+s, y+s, z-s},
                    {x+s, y-s, z-s},
                    {x-s, y-s, z-s},
                    {x-s, y+s, z+s},
                    {x+s, y+s, z+s},
                    {x+s, y-s, z+s},
                    {x-s, y-s, z+s},
                };
                const double cell[8] =
                {
                    interp(F, p[0].x, p[0].y, p[0].z),
                    interp(F, p[1].x, p[1].y, p[1].z),
                    interp(F, p[2].x, p[2].y, p[2].z),
                    interp(F, p[3].x, p[3].y, p[3].z),
                    interp(F, p[4].x, p[4].y, p[4].z),
                    interp(F, p[5].x, p[5].y, p[5].z),
                    interp(F, p[6].x, p[6].y, p[6].z),
                    interp(F, p[7].x, p[7].y, p[7].z),
                };

                std::uint16_t cubeIndex = 0;
                if (cell[0] < 0.0) cubeIndex |= 1;
                if (cell[1] < 0.0) cubeIndex |= 2;
                if (cell[2] < 0.0) cubeIndex |= 4;
                if (cell[3] < 0.0) cubeIndex |= 8;
                if (cell[4] < 0.0) cubeIndex |= 16;
                if (cell[5] < 0.0) cubeIndex |= 32;
                if (cell[6] < 0.0) cubeIndex |= 64;
                if (cell[7] < 0.0) cubeIndex |= 128;

                // Cube is entirely in/out of the surface
                if (_edgeTable[cubeIndex] != 0)
                {
                    glm::vec3 vertlist[12];
                    // Find the vertices where the surface intersects the cube
                    if (_edgeTable[cubeIndex] & 1)
                        vertlist[0] = vInterp(p[0], p[1], cell[0], cell[1]);
                    if (_edgeTable[cubeIndex] & 2)
                        vertlist[1] = vInterp(p[1], p[2], cell[1], cell[2]);
                    if (_edgeTable[cubeIndex] & 4)
                        vertlist[2] = vInterp(p[2], p[3], cell[2], cell[3]);
                    if (_edgeTable[cubeIndex] & 8)
                        vertlist[3] = vInterp(p[3], p[0], cell[3], cell[0]);
                    if (_edgeTable[cubeIndex] & 16)
                        vertlist[4] = vInterp(p[4], p[5], cell[4], cell[5]);
                    if (_edgeTable[cubeIndex] & 32)
                        vertlist[5] = vInterp(p[5], p[6], cell[5], cell[6]);
                    if (_edgeTable[cubeIndex] & 64)
                        vertlist[6] = vInterp(p[6], p[7], cell[6], cell[7]);
                    if (_edgeTable[cubeIndex] & 128)
                        vertlist[7] = vInterp(p[7], p[4], cell[7], cell[4]);
                    if (_edgeTable[cubeIndex] & 256)
                        vertlist[8] = vInterp(p[0], p[4], cell[0], cell[4]);
                    if (_edgeTable[cubeIndex] & 512)
                        vertlist[9] = vInterp(p[1], p[5], cell[1], cell[5]);
                    if (_edgeTable[cubeIndex] & 1024)
                        vertlist[10] = vInterp(p[2], p[6], cell[2], cell[6]);
                    if (_edgeTable[cubeIndex] & 2048)
                        vertlist[11] = vInterp(p[3], p[7], cell[3], cell[7]);

                    // Create the triangle
                    for (std::uint64_t n = 0;
                        _triTable[cubeIndex][n] != -1;
                        n += 3)
                    {
                        std::array<glm::vec3, 3> triangle;
                        triangle[0] =
                            vertlist[static_cast<std::uint8_t>(
                                _triTable[cubeIndex][n  ]
                            )];
                        triangle[1] =
                            vertlist[static_cast<std::uint8_t>(
                                _triTable[cubeIndex][n+1]
                            )];
                        triangle[2] =
                            vertlist[static_cast<std::uint8_t>(
                                _triTable[cubeIndex][n+2]
                            )];

                        std::uint64_t oldSize = vertices.size();
                        vertices.resize(oldSize+9);
                        memcpy(&vertices[oldSize], &triangle, sizeof(float)*9);

                        std::array<glm::vec3, 3> ns;
                        ns[0] = computeNormal(F, triangle[0]);
                        ns[1] = computeNormal(F, triangle[1]);
                        ns[2] = computeNormal(F, triangle[2]);
                        normals.resize(oldSize+9);
                        memcpy(&normals[oldSize], &ns, sizeof(float)*9);
                    }
                }
            }
        }
    }
    indices.resize(vertices.size()/3);
    std::iota(indices.begin(), indices.end(), 0);

    // Write the resulting mesh in .ply file
    std::filesystem::create_directory("result-ply");
    std::filebuf fb_binary;
    std::string path = "result-ply/";
    path += std::to_string(iteration);
    path += ".ply";
    if (!fb_binary.open(path,
                std::ios::out | std::ios::trunc | std::ios::binary))
    {
        ERROR("Failed to open filebuf");
    }
    std::ostream outstream_binary(&fb_binary);
    if (outstream_binary.fail())
    {
        ERROR("Failed to open res.ply file");
    }

    tinyply::PlyFile meshFile;
    meshFile.add_properties_to_element(
            "vertex",
            {"x", "y", "z"},
            tinyply::Type::FLOAT32,
            vertices.size()/3,
            reinterpret_cast<std::uint8_t*>(vertices.data()),
            tinyply::Type::INVALID,
            0
        );
    meshFile.add_properties_to_element(
            "vertex",
            {"nx", "ny", "nz"},
            tinyply::Type::FLOAT32,
            normals.size()/3,
            reinterpret_cast<std::uint8_t*>(normals.data()),
            tinyply::Type::INVALID,
            0
        );
    meshFile.add_properties_to_element(
            "face",
            {"vertex_indices"},
            tinyply::Type::UINT32,
            indices.size()/3,
            reinterpret_cast<std::uint8_t*>(indices.data()),
            tinyply::Type::UINT8,
            3
        );
    meshFile.get_comments().push_back(
            "Generated by Tristan Marrec fluid-simulation project."
        );

    meshFile.write(outstream_binary, true);
    fb_binary.close();
}